

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

void __thiscall
sensors_analytics::utils::ObjectNode::ValueNode::ValueNode(ValueNode *this,ObjectNode *value)

{
  _Rb_tree_header *p_Var1;
  
  this->node_type_ = OBJECT;
  (this->value_).number_value = 0.0;
  *(undefined8 *)((long)&this->value_ + 8) = 0;
  (this->string_data_)._M_dataplus._M_p = (pointer)&(this->string_data_).field_2;
  (this->string_data_)._M_string_length = 0;
  (this->string_data_).field_2._M_local_buf[0] = '\0';
  (this->list_data_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->list_data_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list_data_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->object_data_)._vptr_ObjectNode = (_func_int **)&PTR_SetList_00125d20;
  p_Var1 = &(this->object_data_).properties_map_._M_t._M_impl.super__Rb_tree_header;
  (this->object_data_).properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->object_data_).properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->object_data_).properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->object_data_).properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->object_data_).properties_map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>_>_>
  ::operator=(&(this->object_data_).properties_map_._M_t,&(value->properties_map_)._M_t);
  return;
}

Assistant:

utils::ObjectNode::ValueNode::ValueNode(const utils::ObjectNode &value)
    : node_type_(OBJECT) {
  object_data_ = value;
}